

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cio.c
# Opt level: O1

uint cio_read(opj_cio_t *cio,int n)

{
  byte bVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  
  if (n < 1) {
    uVar2 = 0;
  }
  else {
    iVar4 = n + 1;
    iVar3 = n * 8;
    uVar2 = 0;
    do {
      iVar3 = iVar3 + -8;
      bVar1 = cio_bytein(cio);
      uVar2 = uVar2 + ((uint)bVar1 << ((byte)iVar3 & 0x1f));
      iVar4 = iVar4 + -1;
    } while (1 < iVar4);
  }
  return uVar2;
}

Assistant:

unsigned int cio_read(opj_cio_t *cio, int n) {
	int i;
	unsigned int v;
	v = 0;
	for (i = n - 1; i >= 0; i--) {
		v += cio_bytein(cio) << (i << 3);
	}
	return v;
}